

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

char * dumpNodeList(xmlNodePtr list)

{
  undefined8 uVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  uVar1 = xmlBufferCreate();
  uVar2 = xmlSaveToBuffer(uVar1,"UTF-8",0);
  for (; list != (xmlNodePtr)0x0; list = list->next) {
    xmlSaveTree(uVar2,list);
  }
  xmlSaveClose(uVar2);
  pcVar3 = (char *)xmlBufferDetach(uVar1);
  xmlBufferFree(uVar1);
  return pcVar3;
}

Assistant:

static char *
dumpNodeList(xmlNodePtr list) {
    xmlBufferPtr buffer;
    xmlSaveCtxtPtr save;
    xmlNodePtr cur;
    char *ret;

    buffer = xmlBufferCreate();
    save = xmlSaveToBuffer(buffer, "UTF-8", 0);
    for (cur = list; cur != NULL; cur = cur->next)
        xmlSaveTree(save, cur);
    xmlSaveClose(save);

    ret = (char *) xmlBufferDetach(buffer);
    xmlBufferFree(buffer);
    return(ret);
}